

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O2

void __thiscall iDynTree::MatrixDynSize::fillColMajorBuffer(MatrixDynSize *this,double *colMajorBuf)

{
  size_t sVar1;
  size_t sVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  
  sVar1 = this->m_rows;
  sVar2 = this->m_cols;
  lVar5 = 0;
  for (sVar6 = 0; sVar6 != sVar1; sVar6 = sVar6 + 1) {
    pdVar3 = this->m_data;
    pdVar4 = colMajorBuf;
    for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
      *pdVar4 = *(double *)((long)pdVar3 + sVar7 * 8 + lVar5);
      pdVar4 = pdVar4 + sVar1;
    }
    lVar5 = lVar5 + sVar2 * 8;
    colMajorBuf = colMajorBuf + 1;
  }
  return;
}

Assistant:

void MatrixDynSize::fillColMajorBuffer(double* colMajorBuf) const
{
    for(std::size_t row = 0; row < this->rows(); row++ )
    {
        for(std::size_t col = 0; col < this->cols(); col++ )
        {
            colMajorBuf[this->rawIndexColMajor(row,col)] =
                this->m_data[this->rawIndexRowMajor(row,col)];
        }
    }
}